

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O2

void crec_fill(jit_State *J,TRef trdst,TRef trlen,TRef trfill,CTSize step)

{
  uint uVar1;
  IRRef1 IVar2;
  IRRef1 IVar3;
  TRef TVar4;
  IROpT IVar5;
  IRType IVar6;
  ulong uVar7;
  int32_t k;
  uint uVar8;
  IRType *pIVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  CRecMemList ml [16];
  
  if (-1 < (short)trlen) {
    uVar1 = (J->cur).ir[trlen & 0x7fff].field_1.op12;
    if (uVar1 == 0) {
      return;
    }
    if (uVar1 < 0x81) {
      IVar6 = IRT_U64;
      uVar8 = 0;
      uVar7 = 8;
      uVar12 = 0;
      do {
        uVar12 = uVar12 & 0xffffffff;
        pIVar9 = &ml[uVar12].tp;
        while( true ) {
          uVar10 = uVar8 + (int)uVar7;
          if (uVar1 < uVar10) break;
          if (0xf < uVar12) goto LAB_001571df;
          ((CRecMemList *)(pIVar9 + -1))->ofs = uVar8;
          *pIVar9 = IVar6;
          uVar12 = uVar12 + 1;
          pIVar9 = pIVar9 + 4;
          uVar8 = uVar10;
        }
        uVar7 = uVar7 >> 1;
        IVar6 = IVar6 - IRT_TRUE;
      } while (uVar8 < uVar1);
      if (uVar12 != 0) {
        if (ml[0].tp != IRT_U8 || -1 < (short)(IRRef1)trfill) {
          (J->fold).ins.field_0.op1 = (IRRef1)trfill;
          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b130270;
          trfill = lj_opt_fold(J);
          IVar2 = (IRRef1)trfill;
          if (ml[0].tp != IRT_U8) {
            if (ml[0].tp == IRT_U64) {
              if (-1 < (short)IVar2) {
                (J->fold).ins.field_0.op1 = IVar2;
                *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b1602d4;
                TVar4 = lj_opt_fold(J);
                IVar2 = (IRRef1)TVar4;
              }
              TVar4 = lj_ir_kint64(J,0x101010101010101);
              IVar3 = (IRRef1)TVar4;
              IVar5 = 0x2b16;
            }
            else {
              k = 0x1010101;
              if (ml[0].tp == IRT_U16) {
                k = 0x101;
              }
              TVar4 = lj_ir_kint(J,k);
              IVar3 = (IRRef1)TVar4;
              IVar5 = 0x2b13;
            }
            (J->fold).ins.field_0.ot = IVar5;
            (J->fold).ins.field_0.op1 = IVar2;
            (J->fold).ins.field_0.op2 = IVar3;
            trfill = lj_opt_fold(J);
          }
        }
        for (lVar11 = 0; (uVar12 & 0xffffffff) << 4 != lVar11; lVar11 = lVar11 + 0x10) {
          TVar4 = lj_ir_kint64(J,(ulong)*(uint *)((long)&ml[0].ofs + lVar11));
          (J->fold).ins.field_0.ot = 0x2909;
          (J->fold).ins.field_0.op1 = (IRRef1)trdst;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
          TVar4 = lj_opt_fold(J);
          (J->fold).ins.field_0.ot = (ushort)*(undefined4 *)((long)&ml[0].tp + lVar11) | 0x4e00;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
          (J->fold).ins.field_0.op2 = (IRRef1)trfill;
          lj_opt_fold(J);
        }
        goto LAB_001571f1;
      }
    }
  }
LAB_001571df:
  lj_ir_call(J,IRCALL_memset,trdst,(ulong)trfill);
LAB_001571f1:
  (J->fold).ins.field_0.ot = 0x5a00;
  (J->fold).ins.field_1.op12 = 0;
  lj_opt_fold(J);
  return;
}

Assistant:

static void crec_fill(jit_State *J, TRef trdst, TRef trlen, TRef trfill,
		      CTSize step)
{
  if (tref_isk(trlen)) {  /* Length must be constant. */
    CRecMemList ml[CREC_FILL_MAXUNROLL];
    MSize mlp;
    CTSize len = (CTSize)IR(tref_ref(trlen))->i;
    if (len == 0) return;  /* Shortcut. */
    if (LJ_TARGET_UNALIGNED || step >= CTSIZE_PTR)
      step = CTSIZE_PTR;
    if (step * CREC_FILL_MAXUNROLL < len) goto fallback;
    mlp = crec_fill_unroll(ml, len, step);
    if (!mlp) goto fallback;
    if (tref_isk(trfill) || ml[0].tp != IRT_U8)
      trfill = emitconv(trfill, IRT_INT, IRT_U8, 0);
    if (ml[0].tp != IRT_U8) {  /* Scatter U8 to U16/U32/U64. */
      if (CTSIZE_PTR == 8 && ml[0].tp == IRT_U64) {
	if (tref_isk(trfill))  /* Pointless on x64 with zero-extended regs. */
	  trfill = emitconv(trfill, IRT_U64, IRT_U32, 0);
	trfill = emitir(IRT(IR_MUL, IRT_U64), trfill,
			lj_ir_kint64(J, U64x(01010101,01010101)));
      } else {
	trfill = emitir(IRTI(IR_MUL), trfill,
		   lj_ir_kint(J, ml[0].tp == IRT_U16 ? 0x0101 : 0x01010101));
      }
    }
    crec_fill_emit(J, ml, mlp, trdst, trfill);
  } else {
fallback:
    /* Call memset. Always needs a barrier to disable alias analysis. */
    lj_ir_call(J, IRCALL_memset, trdst, trfill, trlen);  /* Note: arg order! */
  }
  emitir(IRT(IR_XBAR, IRT_NIL), 0, 0);
}